

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

NamespaceData * __thiscall
anon_unknown.dwarf_6f1cc::FindNamespaceInCurrentScope
          (anon_unknown_dwarf_6f1cc *this,ExpressionContext *ctx,InplaceStr name)

{
  bool bVar1;
  uint uVar2;
  NamespaceData **ppNVar3;
  uint local_64;
  NamespaceData *pNStack_60;
  uint i;
  undefined4 local_58;
  NamespaceData *local_50;
  undefined4 local_48;
  NamespaceData *local_40;
  NamespaceData *ns;
  ArrayView<NamespaceData_*> namespaces;
  ExpressionContext *ctx_local;
  InplaceStr name_local;
  
  name_local.begin = name.begin;
  namespaces._8_8_ = this;
  ctx_local = ctx;
  ArrayView<NamespaceData_*>::ArrayView((ArrayView<NamespaceData_*> *)&ns);
  local_40 = ExpressionContext::GetCurrentNamespace
                       ((ExpressionContext *)namespaces._8_8_,
                        *(ScopeData **)(namespaces._8_8_ + 0x8158));
  if (local_40 == (NamespaceData *)0x0) {
    ArrayView<NamespaceData*>::ArrayView<2u>
              ((ArrayView<NamespaceData*> *)&stack0xffffffffffffffa0,
               (SmallArray<NamespaceData_*,_2U> *)(namespaces._8_8_ + 0x8170));
    ns = pNStack_60;
    namespaces.data._0_4_ = local_58;
  }
  else {
    ArrayView<NamespaceData*>::ArrayView<2u>
              ((ArrayView<NamespaceData*> *)&local_50,&local_40->children);
    ns = local_50;
    namespaces.data._0_4_ = local_48;
  }
  local_64 = 0;
  while( true ) {
    uVar2 = ArrayView<NamespaceData_*>::size((ArrayView<NamespaceData_*> *)&ns);
    if (uVar2 <= local_64) {
      return (NamespaceData *)0x0;
    }
    ppNVar3 = ArrayView<NamespaceData_*>::operator[]((ArrayView<NamespaceData_*> *)&ns,local_64);
    bVar1 = InplaceStr::operator==(&((*ppNVar3)->name).name,(InplaceStr *)&ctx_local);
    if (bVar1) break;
    local_64 = local_64 + 1;
  }
  ppNVar3 = ArrayView<NamespaceData_*>::operator[]((ArrayView<NamespaceData_*> *)&ns,local_64);
  return *ppNVar3;
}

Assistant:

NamespaceData* FindNamespaceInCurrentScope(ExpressionContext &ctx, InplaceStr name)
	{
		ArrayView<NamespaceData*> namespaces;

		if(NamespaceData *ns = ctx.GetCurrentNamespace(ctx.scope))
			namespaces = ns->children;
		else
			namespaces = ctx.globalNamespaces;

		for(unsigned i = 0; i < namespaces.size(); i++)
		{
			if(namespaces[i]->name.name == name)
				return namespaces[i];
		}

		return NULL;
	}